

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

JavascriptString *
Js::TMapKey_ConvertKey<Js::JavascriptString*>(ScriptContext *scriptContext,PropertyRecord *key)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyString *pPVar4;
  
  if ((uint)key->pid < 0x10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2b,"(!IsInternalPropertyId(key->GetPropertyId()))",
                                "!IsInternalPropertyId(key->GetPropertyId())");
    if (!bVar2) goto LAB_00dcff6b;
    *puVar3 = 0;
  }
  if (key->isSymbol == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2d,"(!key->IsSymbol())","!key->IsSymbol()");
    if (!bVar2) {
LAB_00dcff6b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar4 = ScriptContext::GetPropertyString(scriptContext,key->pid);
  return &pPVar4->super_JavascriptString;
}

Assistant:

JavascriptString* TMapKey_ConvertKey(ScriptContext* scriptContext, const PropertyRecord* key)
    {
        // String keyed type handlers can't handle InternalPropertyIds because they have no string representation
        // so assert that no code paths convert InternalPropertyIds to PropertyStrings.
        Assert(!IsInternalPropertyId(key->GetPropertyId()));
        // The same is true for symbols - we should not be converting a symbol property into a PropertyString.
        Assert(!key->IsSymbol());

        return scriptContext->GetPropertyString(key->GetPropertyId());
    }